

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Point2f st;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  SampledSpectrum SVar8;
  Tuple3<pbrt::Vector3,_float> local_20;
  
  fVar7 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar4 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar7 = auVar4._0_4_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar6,auVar6);
  auVar5 = vfmadd231ss_fma(auVar5,auVar3,auVar3);
  auVar5 = vsqrtss_avx(auVar5,auVar5);
  local_20.z = auVar5._0_4_;
  auVar5._0_4_ = auVar6._0_4_ / local_20.z;
  auVar5._4_12_ = auVar6._4_12_;
  auVar6._0_4_ = fVar7 / local_20.z;
  auVar6._4_12_ = auVar4._4_12_;
  local_20.z = auVar3._0_4_ / local_20.z;
  auVar5 = vinsertps_avx(auVar5,auVar6,0x10);
  local_20._0_8_ = vmovlps_avx(auVar5);
  st = EqualAreaSphereToSquare((Vector3f *)&local_20);
  SVar8 = LookupLe(this,st,lambda);
  return (array<float,_4>)(array<float,_4>)SVar8;
}

Assistant:

Le(const Ray &ray, const SampledWavelengths &lambda) const {
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
        Point2f st = EqualAreaSphereToSquare(wl);
        return LookupLe(st, lambda);
    }